

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O3

uint32_t __thiscall
cppnet::BufferBlock::ReadUntil
          (BufferBlock *this,char *res,uint32_t len,char *find,uint32_t find_len,uint32_t *need_len)

{
  uint uVar1;
  uint32_t uVar2;
  
  uVar1 = (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[9])(this,find,(ulong)find_len);
  if (uVar1 != 0) {
    if (uVar1 <= len) {
      uVar2 = (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[3])(this,res,(ulong)len);
      return uVar2;
    }
    *need_len = uVar1;
  }
  return 0;
}

Assistant:

uint32_t BufferBlock::ReadUntil(char* res, uint32_t len, const char* find, uint32_t find_len, uint32_t& need_len)  {
    uint32_t size = FindStr(find, find_len);
    if (size) {
        if (size <= len) {
            return Read(res, len);
        
        } else {
            need_len = size;
            return 0;
        }
    }

    return 0;
}